

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

int cargo_parse(cargo_t ctx,cargo_flags_t flags,int start_index,int argc,char **argv)

{
  char *pcVar1;
  cargo_parse_result_t cVar2;
  cargo_parse_result_t cVar3;
  char **ppcVar4;
  int *piVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  char **argv_00;
  size_t sVar11;
  int iVar12;
  uint uVar13;
  cargo_flags_t cVar14;
  bool bVar15;
  cargo_opt_t *opt;
  cargo_opt_t *local_60;
  cargo_flags_t local_54;
  ulong local_50;
  char *local_48;
  ulong local_40;
  char **local_38;
  
  uVar9 = (ulong)(uint)argc;
  local_60 = (cargo_opt_t *)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x13f3,"int cargo_parse(cargo_t, cargo_flags_t, int, int, char **)");
  }
  cVar14 = ctx->flags;
  if (flags != 0) {
    ctx->flags = flags;
  }
  ctx->argc = argc;
  ctx->argv = argv;
  ctx->start = start_index;
  ctx->stopped = 0;
  ctx->stopped_hard = 0;
  pcVar1 = ctx->error;
  argv_00 = argv;
  if (pcVar1 != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar1);
    }
    else {
      (*replaced_cargo_free)(pcVar1);
    }
    ctx->error = (char *)0x0;
  }
  ctx->error = (char *)0x0;
  _cargo_add_help_if_missing(ctx);
  _cargo_add_orphans_to_default_group(ctx);
  ppcVar4 = ctx->args;
  if (ppcVar4 != (char **)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(ppcVar4);
    }
    else {
      (*replaced_cargo_free)(ppcVar4);
    }
    ctx->args = (char **)0x0;
  }
  ctx->arg_count = 0;
  ppcVar4 = ctx->unknown_opts;
  if (ppcVar4 != (char **)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(ppcVar4);
    }
    else {
      (*replaced_cargo_free)(ppcVar4);
    }
    ctx->unknown_opts = (char **)0x0;
  }
  piVar5 = ctx->unknown_opts_idxs;
  if (piVar5 != (int *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(piVar5);
    }
    else {
      (*replaced_cargo_free)(piVar5);
    }
    ctx->unknown_opts_idxs = (int *)0x0;
  }
  ctx->unknown_opts_count = 0;
  _cargo_cleanup_option_values(ctx,0);
  sVar11 = (size_t)argc;
  ppcVar4 = (char **)_cargo_calloc(sVar11,8);
  ctx->args = ppcVar4;
  cVar3 = CARGO_PARSE_NOMEM;
  if (ppcVar4 != (char **)0x0) {
    ppcVar4 = (char **)_cargo_calloc(sVar11,8);
    ctx->unknown_opts = ppcVar4;
    if (ppcVar4 != (char **)0x0) {
      piVar5 = (int *)_cargo_calloc(sVar11,4);
      ctx->unknown_opts_idxs = piVar5;
      if (piVar5 != (int *)0x0) {
        if ((ctx->flags & (CARGO_SKIP_CHECK_UNKNOWN|CARGO_UNKNOWN_EARLY)) == CARGO_UNKNOWN_EARLY) {
          cVar2 = _cargo_check_unknown_options(ctx);
          cVar3 = CARGO_PARSE_UNKNOWN_OPTS;
          if (cVar2 != CARGO_PARSE_OK) goto LAB_001058d3;
        }
        iVar12 = ctx->start;
        ctx->i = iVar12;
        if (iVar12 < ctx->argc) {
          local_50 = 0;
          local_54 = cVar14;
          local_38 = argv;
          do {
            if (ctx->stopped == 0) {
              pcVar1 = argv[iVar12];
              pcVar6 = _cargo_find_full_option(ctx,&local_60,pcVar1);
              if (pcVar6 == (char *)0x0) {
                pcVar7 = _cargo_is_arg_combined_option(ctx,pcVar1);
                if (pcVar7 == (char *)0x0) {
                  if (ctx->opt_count != 0) {
                    piVar5 = &ctx->options->positional;
                    sVar11 = 0;
                    do {
                      if ((*piVar5 != 0) && (piVar5[0x29] != piVar5[2])) {
                        bVar15 = true;
                        goto LAB_00105b4e;
                      }
                      sVar11 = sVar11 + 1;
                      piVar5 = piVar5 + 0x4a;
                    } while (ctx->opt_count != sVar11);
                  }
                  sVar11 = 0;
                  bVar15 = false;
LAB_00105b4e:
                  local_60 = ctx->options + sVar11;
                  goto LAB_001059b3;
                }
                local_40 = CONCAT71((int7)((ulong)pcVar7 >> 8),pcVar7 != (char *)0x0);
                sVar8 = strlen(pcVar1);
                uVar13 = 0;
                bVar15 = sVar8 >= 2;
                if (sVar8 < 2) {
                  cVar3 = CARGO_PARSE_OK;
                  uVar13 = 0;
                }
                else {
                  uVar10 = 1;
                  local_48 = pcVar6;
                  do {
                    pcVar6 = _cargo_find_short_option(ctx,&local_60,pcVar1[uVar10]);
                    if (pcVar6 == (char *)0x0) {
                      __assert_fail("combined != NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                                    ,0x1456,
                                    "int cargo_parse(cargo_t, cargo_flags_t, int, int, char **)");
                    }
                    cVar3 = _cargo_parse_option(ctx,local_60,pcVar6,(int)uVar9,argv_00);
                    if (cVar3 < CARGO_PARSE_OK) {
                      uVar13 = 2;
                      local_50 = (ulong)(uint)cVar3;
                      pcVar6 = local_48;
                      break;
                    }
                    uVar10 = uVar10 + 1;
                    sVar8 = strlen(pcVar1);
                    bVar15 = uVar10 < sVar8;
                    pcVar6 = local_48;
                  } while (bVar15);
                }
                uVar9 = local_40;
                cVar14 = local_54;
                if (!bVar15) {
                  bVar15 = false;
                  goto LAB_001059b5;
                }
              }
              else {
                bVar15 = true;
LAB_001059b3:
                cVar3 = CARGO_PARSE_OK;
                uVar9 = 0;
LAB_001059b5:
                if (bVar15) {
                  cVar3 = _cargo_parse_option(ctx,local_60,pcVar6,(int)uVar9,argv_00);
                  local_50 = local_50 & 0xffffffff;
                  if (cVar3 < CARGO_PARSE_OK) {
                    local_50 = (ulong)(uint)cVar3;
                  }
                  uVar13 = (uint)cVar3 >> 0x1e & 0xfffffffe;
                }
                else {
                  uVar13 = 0;
                  if ((char)uVar9 == '\0') {
                    sVar11 = ctx->arg_count;
                    ctx->args[sVar11] = ctx->argv[ctx->i];
                    uVar9 = sVar11 + 1;
                    ctx->arg_count = uVar9;
                    cVar3 = CARGO_PARSE_SHOW_HELP;
                  }
                }
              }
              argv = local_38;
              if (uVar13 != 0) {
                if (uVar13 != 2) {
                  return (int)pcVar6;
                }
                cVar3 = (cargo_parse_result_t)local_50;
                goto LAB_001058d3;
              }
            }
            else {
              sVar11 = ctx->arg_count;
              ctx->args[sVar11] = ctx->argv[iVar12];
              uVar9 = sVar11 + 1;
              ctx->arg_count = uVar9;
              cVar3 = CARGO_PARSE_SHOW_HELP;
            }
            iVar12 = cVar3 + (uint)(cVar3 == CARGO_PARSE_OK) + ctx->i;
            ctx->i = iVar12;
          } while (iVar12 < ctx->argc);
        }
        if (ctx->help != 0) {
          cargo_fprint_usage(ctx,_stdout,CARGO_USAGE_FULL);
          cVar2 = CARGO_PARSE_SHOW_HELP;
          goto LAB_00105920;
        }
        cVar2 = CARGO_PARSE_OK;
        if (ctx->stopped_hard != 0) goto LAB_00105920;
        if ((ctx->flags & CARGO_SKIP_CHECK_REQUIRED) == 0) {
          iVar12 = _cargo_check_required_options(ctx);
          cVar3 = CARGO_PARSE_MISS_REQUIRED;
          if (iVar12 != 0) goto LAB_001058d3;
        }
        if ((((ctx->flags & CARGO_SKIP_CHECK_MUTEX) != 0) ||
            (cVar3 = _cargo_check_mutex_groups(ctx), cVar3 == CARGO_PARSE_OK)) &&
           (((ctx->flags & CARGO_SKIP_CHECK_UNKNOWN) != 0 ||
            (cVar3 = _cargo_check_unknown_options_after(ctx), cVar3 == CARGO_PARSE_OK)))) {
          if ((ctx->flags & CARGO_NOWARN) == 0) {
            _cargo_parse_show_error(ctx);
          }
          goto LAB_00105920;
        }
      }
    }
  }
LAB_001058d3:
  cVar2 = cVar3;
  if ((ctx->unknown_opts_count == 0) && ((ctx->flags >> 0xd & 1) == 0)) {
    cVar3 = CARGO_PARSE_OK;
    if ((ctx->flags >> 9 & 1) == 0) {
      if (ctx->stopped == 0) {
        ctx->stopped = ctx->argc;
      }
      cVar3 = _cargo_check_unknown_options(ctx);
    }
    if (cVar3 != CARGO_PARSE_OK) {
      cVar2 = cVar3;
    }
  }
  _cargo_parse_show_error(ctx);
  _cargo_cleanup_option_values(ctx,1);
LAB_00105920:
  ctx->flags = cVar14;
  return cVar2;
}

Assistant:

int cargo_parse(cargo_t ctx, cargo_flags_t flags, int start_index, int argc, char **argv)
{
    int ret = CARGO_PARSE_OK;
    int start = 0;
    int opt_arg_count = 0;
    char *arg = NULL;
    const char *name = NULL;
    cargo_opt_t *opt = NULL;
    cargo_flags_t global_flags = ctx->flags;
    assert(ctx);

    // Override if any flags are set.
    if (flags)
    {
        ctx->flags = flags;
    }

    CARGODBG(2, "============ Cargo Parse =============\n");

    ctx->argc = argc;
    ctx->argv = argv;
    ctx->start = start_index;
    ctx->stopped = 0;
    ctx->stopped_hard = 0;

    _cargo_set_error(ctx, NULL);

    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);

    _cargo_free_str_list(&ctx->args, NULL);
    ctx->arg_count = 0;

    _cargo_free_str_list(&ctx->unknown_opts, NULL);
    _cargo_xfree(&ctx->unknown_opts_idxs);
    ctx->unknown_opts_count = 0;

    // Make sure we start over, if this function is
    // called more than once.
    // (But we don't free the values since we don't want to
    //  overwrite default or already parsed values)
    _cargo_cleanup_option_values(ctx, 0);

    // TODO: Handle the case when argc == 0 (this will fail then).
    if (!(ctx->args = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts = (char **)_cargo_calloc(argc, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory!\n");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    if (!(ctx->unknown_opts_idxs = _cargo_calloc(argc, sizeof(int))))
    {
        CARGODBG(1, "Out of memory");
        ret = CARGO_PARSE_NOMEM; goto fail;
    }

    CARGODBG(2, "Parse arg list of count %d start at index %d\n", argc, start_index);

    // Check for unknown options early.
    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ctx->flags & CARGO_UNKNOWN_EARLY)
        && _cargo_check_unknown_options(ctx))
    {
        ret = CARGO_PARSE_UNKNOWN_OPTS; goto fail;
    }

    for (ctx->i = ctx->start; ctx->i < ctx->argc; )
    {
        arg = argv[ctx->i];
        start = ctx->i;
        opt_arg_count = 0;

        CARGODBG(3, "\n");
        CARGODBG(3, "argv[%d] = %s\n", ctx->i, arg);
        CARGODBG(3, "  Look for opt matching %s:\n", arg);

        // TODO: Add support for a "--" option which forces all
        // options specified after it to be parsed as positional arguments
        // and not options. Say there's a file named "-thefile".

        // TODO: Add support for abbreviated prefix matching so that
        // --ar will match --arne unless it's ambigous with some other option.
        if (!ctx->stopped)
        {
            size_t opt_i = 0;
            int is_positional = 0;
            int is_combined = 0;

            // Look for options "--myoption 1 2 3"
            if (!(name = _cargo_find_full_option(ctx, &opt, arg)))
            {
                // Is this a set of combined short options?
                // -a -b -c -> -abc
                if ((is_combined = (_cargo_is_arg_combined_option(ctx, arg) != NULL)))
                {
                    size_t i;
                    const char *combined = NULL;

                    // Skip '-' by starting at 1.
                    for (i = 1; i < strlen(arg); i++)
                    {
                        combined = _cargo_find_short_option(ctx, &opt, arg[i]);
                        assert(combined != NULL);

                        if ((opt_arg_count = _cargo_parse_option(ctx, opt, combined,
                                                                argc, argv)) < 0)
                        {
                            CARGODBG(1, "Failed to parse %s option: %s\n",
                                    _cargo_type_to_str(opt->type), opt->name[0]);
                            ret = opt_arg_count; goto fail;
                        }
                    }
                }
                else
                {
                    // Or a positional argument "1 2 3"
                    // (just an argument that is parsed into a specific options target)
                    is_positional = !_cargo_get_positional(ctx, &opt_i);
                    opt = &ctx->options[opt_i];
                    CARGODBG(2, "    Positional argument: %s\n", argv[ctx->i]);
                }
            }

            if (name || is_positional)
            {
                // We found an option, parse any arguments it might have.
                if ((opt_arg_count = _cargo_parse_option(ctx, opt, name,
                                                        argc, argv)) < 0)
                {
                    CARGODBG(1, "Failed to parse %s option: %s\n",
                            _cargo_type_to_str(opt->type), opt->name[0]);
                    ret = opt_arg_count; goto fail;
                }
            }
            else if (!is_combined)
            {
                // A leftover argument that no option wants.
                opt_arg_count = _cargo_add_extra_arg(ctx);
            }
        }
        else
        {
            // Stopped parsing, so everything is saved as extra arguments.
            opt_arg_count = _cargo_add_extra_arg(ctx);
        }

        if (opt_arg_count == 0)
            opt_arg_count = 1;

        CARGODBG(3, "opt_arg_count == %d\n", opt_arg_count);

        ctx->i += opt_arg_count;

        #if CARGO_DEBUG
        _cargo_debug_print_eaten_args(ctx, start, opt_arg_count);
        #endif // CARGO_DEBUG
    }

    // Print automatic help.
    if (ctx->help)
    {
        cargo_print_usage(ctx, 0);
        ctx->flags = global_flags;
        return CARGO_PARSE_SHOW_HELP;
    }

    // An option can cause a "hard stop", meaning that there
    // won't be any errors for mutex groups and so on. This is
    // useful for cases where you have --advanced_help or similar
    // where you just want to show some extended help without also
    // having to specify required arguments.
    if (ctx->stopped_hard)
    {
        goto skip_checks;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_REQUIRED)
        && _cargo_check_required_options(ctx))
    {
        ret = CARGO_PARSE_MISS_REQUIRED; goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_MUTEX)
        && (ret = _cargo_check_mutex_groups(ctx)))
    {
        goto fail;
    }

    if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
        && (ret = _cargo_check_unknown_options_after(ctx)))
    {
        goto fail;
    }

    // Shows warnings.
    if (!(ctx->flags & CARGO_NOWARN))
    {
        _cargo_parse_show_error(ctx);
    }

skip_checks:
    ctx->flags = global_flags;
    return CARGO_PARSE_OK;

fail:
    // Let unknown options override other errors.
    // But don't check for them more than once.
    if (ctx->unknown_opts_count == 0)
    {
        int unknown_ret = 0;
        if (!(ctx->flags & CARGO_SKIP_CHECK_UNKNOWN)
            && (unknown_ret = _cargo_check_unknown_options_after(ctx)))
        {
            CARGODBG(1, "Unknown option overrides previous error\n");
            ret = unknown_ret;
        }
    }

    _cargo_parse_show_error(ctx);
    _cargo_cleanup_option_values(ctx, 1);
    ctx->flags = global_flags;
    return ret;
}